

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Int_t *
Acb_FindSupportNext(sat_solver *pSat,int iFirstDiv,Vec_Int_t *vWeights,Vec_Wrd_t *vPats,int *pnPats)

{
  word *pwVar1;
  uint uVar2;
  word *pwVar3;
  lit *begin;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  word wVar9;
  int iVar10;
  int iVar11;
  Vec_Int_t *p;
  int *piVar12;
  long lVar13;
  Vec_Int_t *extraout_RDX;
  Vec_Int_t *extraout_RDX_00;
  Vec_Int_t *vWeights_00;
  word Mask [256];
  undefined8 local_838;
  uint auStack_830 [512];
  
  uVar2 = vWeights->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar12 = (int *)malloc(400);
  p->pArray = piVar12;
  memset(&local_838,0xff,0x800);
  iVar10 = *pnPats;
  vWeights_00 = extraout_RDX;
  while( true ) {
    iVar10 = Acb_FindArgMaxUnderMask(vPats,&local_838,vWeights_00,iVar10);
    if (iVar10 + iFirstDiv < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(p,(iVar10 + iFirstDiv) * 2 + 1);
    if ((iVar10 < 0) || (vPats->nSize <= iVar10 * 0x100)) break;
    pwVar3 = vPats->pArray;
    lVar13 = 0;
    do {
      pwVar1 = pwVar3 + (ulong)(uint)(iVar10 * 0x100) + lVar13;
      uVar4 = *(uint *)((long)pwVar1 + 4);
      wVar9 = pwVar1[1];
      uVar5 = *(uint *)((long)pwVar1 + 0xc);
      uVar6 = auStack_830[lVar13 * 2 + -1];
      uVar7 = auStack_830[lVar13 * 2];
      uVar8 = auStack_830[lVar13 * 2 + 1];
      *(uint *)(&local_838 + lVar13) = ~(uint)*pwVar1 & *(uint *)(&local_838 + lVar13);
      auStack_830[lVar13 * 2 + -1] = ~uVar4 & uVar6;
      auStack_830[lVar13 * 2] = ~(uint)wVar9 & uVar7;
      auStack_830[lVar13 * 2 + 1] = ~uVar5 & uVar8;
      lVar13 = lVar13 + 2;
    } while (lVar13 != 0x100);
    begin = p->pArray;
    iVar10 = p->nSize;
    iVar11 = sat_solver_solve(pSat,begin,begin + iVar10,0,0,0,0);
    if (iVar11 != 1) {
      if (iVar11 == -1) {
        qsort(begin,(long)iVar10,4,Vec_IntSortCompare1);
        return p;
      }
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                    ,1000,
                    "Vec_Int_t *Acb_FindSupportNext(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int *)"
                   );
    }
    vWeights_00 = extraout_RDX_00;
    if (0 < (int)uVar2) {
      lVar13 = 0;
      vWeights_00 = (Vec_Int_t *)(ulong)(uint)iFirstDiv;
      do {
        if ((iFirstDiv < 0) || (pSat->size <= (int)vWeights_00)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (pSat->model[(long)vWeights_00] == 1) {
          if (vPats->nSize <= lVar13) goto LAB_00395582;
          vPats->pArray[(*pnPats >> 6) + lVar13] =
               vPats->pArray[(*pnPats >> 6) + lVar13] | 1L << ((byte)*pnPats & 0x3f);
        }
        vWeights_00 = (Vec_Int_t *)((long)&vWeights_00->nCap + 1);
        lVar13 = lVar13 + 0x100;
      } while ((ulong)uVar2 << 8 != lVar13);
    }
    iVar11 = *pnPats;
    iVar10 = iVar11 + 1;
    *pnPats = iVar10;
    if (iVar10 == 0x4000) {
      printf("Exceeded %d words.\n",0x100);
      if (begin != (lit *)0x0) {
        free(begin);
      }
      free(p);
      return (Vec_Int_t *)0x0;
    }
    if (0x3ffe < iVar11) {
      __assert_fail("*pnPats < NWORDS*64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                    ,0x3f7,
                    "Vec_Int_t *Acb_FindSupportNext(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int *)"
                   );
    }
  }
LAB_00395582:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

Vec_Int_t * Acb_FindSupportNext( sat_solver * pSat, int iFirstDiv, Vec_Int_t * vWeights, Vec_Wrd_t * vPats, int * pnPats )
{
    int i, status, nDivs = Vec_IntSize(vWeights);
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    word * pMask, Mask[NWORDS]; Abc_TtConst( Mask, NWORDS, 1 );
    while ( 1 )
    {
        int iDivBest = Acb_FindArgMaxUnderMask( vPats, Mask, vWeights, *pnPats ); 
        Vec_IntPush( vSupp, Abc_Var2Lit(iFirstDiv+iDivBest, 1) );
        //printf( "Selecting divisor %d with weight %d\n", iDivBest, Vec_IntEntry(vWeights, iDivBest) );
//        Mask &= ~Vec_WrdEntry( vPats, iDivBest );
        pMask = Vec_WrdEntryP( vPats, NWORDS*iDivBest );
        Abc_TtAndSharp( Mask, Mask, pMask, NWORDS, 1 );

        // try one run
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status == l_False )
            break;
        assert( status == l_True );
        // collect pattern
        for ( i = 0; i < nDivs; i++ )
        {
            if ( sat_solver_var_value(pSat, iFirstDiv+i) == 0 )
                continue;
            Abc_TtSetBit( Vec_WrdEntryP(vPats, NWORDS*i), *pnPats );
        }
        (*pnPats)++;
        if ( *pnPats == NWORDS*64 )
        {
            printf( "Exceeded %d words.\n", NWORDS );
            Vec_IntFreeP( &vSupp );
            return NULL;
        }
        assert( *pnPats < NWORDS*64 );
        //Acb_PrintPatterns( vPats, *pnPats, vWeights );
        //i = i;
    }
    Vec_IntSort( vSupp, 0 );
    return vSupp;
}